

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.c
# Opt level: O0

int X509_NAME_get_text_by_OBJ(X509_NAME *name,ASN1_OBJECT *obj,char *buf,int len)

{
  int loc;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *pAVar1;
  ASN1_STRING *data;
  int i;
  int local_34;
  int local_4;
  
  loc = X509_NAME_get_index_by_OBJ(name,obj,-1);
  if (loc < 0) {
    local_4 = -1;
  }
  else {
    ne = X509_NAME_get_entry(name,loc);
    pAVar1 = X509_NAME_ENTRY_get_data(ne);
    if (buf == (char *)0x0) {
      local_4 = pAVar1->length;
    }
    else if (len < 1) {
      local_4 = 0;
    }
    else {
      if (len + -1 < pAVar1->length) {
        local_34 = len + -1;
      }
      else {
        local_34 = pAVar1->length;
      }
      memcpy(buf,pAVar1->data,(long)local_34);
      buf[local_34] = '\0';
      local_4 = local_34;
    }
  }
  return local_4;
}

Assistant:

int X509_NAME_get_text_by_OBJ(const X509_NAME *name, const ASN1_OBJECT *obj,
                              char *buf, int len)
{
    int i;
    const ASN1_STRING *data;

    i = X509_NAME_get_index_by_OBJ(name, obj, -1);
    if (i < 0)
        return -1;
    data = X509_NAME_ENTRY_get_data(X509_NAME_get_entry(name, i));
    if (buf == NULL)
        return data->length;
    if (len <= 0)
        return 0;
    i = (data->length > (len - 1)) ? (len - 1) : data->length;
    memcpy(buf, data->data, i);
    buf[i] = '\0';
    return i;
}